

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_escaping.cc
# Opt level: O2

void google::protobuf::util::converter::JsonEscaping::Escape(ByteSource *input,ByteSink *output)

{
  bool bVar1;
  ulong uVar2;
  undefined3 uVar3;
  undefined4 uVar4;
  byte bVar5;
  undefined1 uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar8;
  long extraout_RDX;
  ulong uVar9;
  long i;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  StringPiece SVar14;
  stringpiece_ssize_type sStack_a0;
  StringPiece local_70;
  ByteSource *local_60;
  ulong local_58;
  char *local_50;
  uint local_44;
  undefined8 local_40;
  char buffer [12];
  
  local_40 = 0x755c64616564755c;
  builtin_strncpy(buffer,"bee",4);
  uVar10 = 0;
  local_60 = input;
  uVar12 = 0;
  do {
    iVar7 = (*input->_vptr_ByteSource[2])(input);
    if (CONCAT44(extraout_var,iVar7) == 0) {
      return;
    }
    iVar7 = (*input->_vptr_ByteSource[3])(input);
    local_50 = (char *)0x0;
    uVar9 = 0;
    uVar11 = uVar12;
    do {
      uVar13 = 0;
      iVar8 = (int)uVar9;
      local_70.ptr_ = (char *)CONCAT44(extraout_var_00,iVar7);
      local_70.length_ = extraout_RDX;
      if (uVar11 == 0) {
        bVar5 = StringPiece::operator[](&local_70,(long)iVar8);
        uVar10 = (uint)bVar5;
        if ((char)bVar5 < '\0') {
          if (0xbf < bVar5) {
            iVar8 = iVar8 + 1;
            if (bVar5 < 0xe0) {
              uVar10 = uVar10 & 0x1f;
              uVar13 = 1;
              uVar11 = 1;
            }
            else {
              if (bVar5 < 0xf0) {
                uVar10 = uVar10 & 0xf;
                uVar11 = 2;
              }
              else {
                if (0xf7 < bVar5) goto LAB_0032c397;
                uVar10 = uVar10 & 7;
                uVar11 = 3;
              }
              uVar13 = 1;
            }
            goto LAB_0032c087;
          }
LAB_0032c397:
          uVar11 = 0;
          uVar13 = 1;
          bVar1 = false;
          local_58 = uVar9;
LAB_0032c3a5:
          SVar14.length_ = 0;
          SVar14.ptr_ = local_50;
          uVar9 = local_58;
          local_44 = uVar11;
          goto LAB_0032c3b0;
        }
        local_44 = 0;
        uVar13 = 1;
      }
      else {
LAB_0032c087:
        local_44 = (int)uVar11 >> 0x1f & uVar11;
        i = (long)iVar8;
        local_58 = uVar9;
        while (0 < (int)uVar11) {
          bVar1 = local_70.length_ <= i;
          if (local_70.length_ <= i) goto LAB_0032c3a5;
          bVar5 = StringPiece::operator[](&local_70,i);
          uVar11 = uVar11 - 1;
          uVar13 = uVar13 + 1;
          uVar10 = uVar10 << 6 | (uint)(bVar5 & 0x3f);
          i = i + 1;
          if (-0x41 < (char)bVar5) goto LAB_0032c3a5;
        }
        bVar1 = false;
        uVar9 = local_58;
        if ((0x10ffff < uVar10) || ((uVar10 & 0xfffff800) == 0xd800)) {
          SVar14.length_ = 0;
          SVar14.ptr_ = local_50;
          goto LAB_0032c3b0;
        }
      }
      if (0x9f < uVar10) {
        if ((((((uVar10 - 0xfff9 < 3) || (uVar10 - 0x17b4 < 2)) || (uVar10 == 0xad)) ||
             ((uVar10 == 0x6dd || (uVar10 == 0xfeff)))) ||
            (((uVar10 == 0x70f || ((uVar10 & 0xfffffffc) == 0x600)) ||
             ((uVar10 - 0x200b < 0x24 &&
              ((0xfe000001fU >> ((ulong)(uVar10 - 0x200b) & 0x3f) & 1) != 0)))))) ||
           ((uVar10 - 0x2060 < 0x10 && ((0xfc1fU >> (uVar10 - 0x2060 & 0x1f) & 1) != 0)))) {
          SVar14 = anon_unknown_0::ToHex((uint16)uVar10,(char *)&local_40);
          goto LAB_0032c1ef;
        }
        if (((0x5f < uVar10 - 0xe0020) && (7 < uVar10 - 0x1d173)) &&
           (SVar14 = (StringPiece)ZEXT816(0), uVar10 != 0xe0001)) goto LAB_0032c1ef;
        uVar12 = (uVar10 >> 10) - 0x2840;
        buffer[3] = "0123456789abcdef"[uVar10 & 0xf];
        buffer[2] = "0123456789abcdef"[uVar10 >> 4 & 0xf];
        buffer[1] = "0123456789abcdef"[(ulong)(uVar10 >> 8 & 3) + 0xc];
        buffer[0] = 'd';
        local_40._0_3_ = CONCAT12("0123456789abcdef"[(uVar12 & 0xffff) >> 0xc],(undefined2)local_40)
        ;
        local_40 = CONCAT53(CONCAT41(CONCAT31(CONCAT21(local_40._6_2_,
                                                       "0123456789abcdef"[uVar10 >> 10 & 0xf]),
                                              "0123456789abcdef"[uVar12 >> 4 & 0xf]),
                                     "0123456789abcdef"[uVar12 >> 8 & 0xf]),(undefined3)local_40);
        local_50 = (char *)&local_40;
        sStack_a0 = 0xc;
LAB_0032c43e:
        SVar14.length_ = sStack_a0;
        SVar14.ptr_ = local_50;
        bVar1 = true;
        goto LAB_0032c3b0;
      }
      StringPiece::StringPiece(&local_70,(anonymous_namespace)::kCommonEscapes + (ulong)uVar10 * 7);
      SVar14.length_ = local_70.length_;
      SVar14.ptr_ = local_70.ptr_;
LAB_0032c1ef:
      local_50 = SVar14.ptr_;
      if ((0 < (int)uVar12) && (SVar14.length_ == 0)) {
        uVar2 = CONCAT26(local_40._6_2_,CONCAT15((char)uVar10,(undefined5)local_40)) &
                0xffff3fffffffffff;
        uVar3 = (undefined3)(uVar2 >> 0x28);
        uVar6 = (undefined1)(uVar10 >> 6);
        local_40._0_4_ = (undefined4)uVar2;
        if (uVar10 < 0x800) {
          local_40 = CONCAT35(uVar3,CONCAT14(uVar6,(undefined4)local_40)) | 0x80c000000000;
          local_50 = (char *)((long)&local_40 + 4);
          sStack_a0 = 2;
        }
        else {
          uVar2 = CONCAT35(uVar3,CONCAT14(uVar6,(undefined4)local_40)) & 0xffffff3fffffffff;
          uVar4 = (undefined4)(uVar2 >> 0x20);
          uVar6 = (undefined1)(uVar10 >> 0xc);
          local_40._0_3_ = (undefined3)uVar2;
          if (uVar10 < 0x10000) {
            local_40 = CONCAT44(uVar4,CONCAT13(uVar6,(undefined3)local_40)) | 0x8080e0000000;
            local_50 = (char *)((long)&local_40 + 3);
            sStack_a0 = 3;
          }
          else {
            uVar2 = CONCAT44(uVar4,CONCAT13(uVar6,(undefined3)local_40)) & 0xffffffff3fffffff;
            local_40._0_2_ = (undefined2)uVar2;
            local_40 = CONCAT53((int5)(uVar2 >> 0x18),
                                CONCAT12((char)(uVar10 >> 0x12),(undefined2)local_40)) |
                       0x808080f00000;
            local_50 = (char *)((long)&local_40 + 2);
            sStack_a0 = 4;
          }
        }
        goto LAB_0032c43e;
      }
      bVar1 = true;
      if (SVar14.length_ != 0) goto LAB_0032c3b0;
      uVar13 = (int)uVar9 + uVar13;
      uVar9 = (ulong)uVar13;
      uVar11 = local_44;
    } while ((int)uVar13 < extraout_RDX);
    SVar14.length_ = 0;
    SVar14.ptr_ = local_50;
    uVar13 = 0;
LAB_0032c3b0:
    local_50 = SVar14.ptr_;
    if (0 < (int)uVar9) {
      (*local_60->_vptr_ByteSource[5])(local_60,output,uVar9 & 0xffffffff);
    }
    if (0 < (int)uVar13) {
      (*local_60->_vptr_ByteSource[4])(local_60,(ulong)uVar13);
    }
    input = local_60;
    uVar12 = 0;
    if (((bVar1) && (uVar12 = local_44, local_44 == 0)) && (uVar12 = 0, SVar14.length_ != 0)) {
      (*output->_vptr_ByteSink[2])(output,local_50,SVar14.length_);
      uVar12 = 0;
    }
  } while( true );
}

Assistant:

void JsonEscaping::Escape(strings::ByteSource* input,
                          strings::ByteSink* output) {
  char buffer[12] = "\\udead\\ubee";
  uint32 cp = 0;     // Current unicode code point.
  int num_left = 0;  // Num of chars to read to complete the code point.
  while (input->Available() > 0) {
    StringPiece str = input->Peek();
    StringPiece escaped;
    int i = 0;
    int num_read;
    bool ok;
    bool cp_was_split = num_left > 0;
    // Loop until we encounter either
    //   i) a code point that needs to be escaped; or
    //  ii) a split code point is completely read; or
    // iii) a character that is not a valid utf8; or
    //  iv) end of the StringPiece str is reached.
    do {
      ok = ReadCodePoint(str, i, &cp, &num_left, &num_read);
      if (num_left > 0 || !ok) break;  // case iii or iv
      escaped = EscapeCodePoint(cp, buffer, cp_was_split);
      if (!escaped.empty()) break;  // case i or ii
      i += num_read;
      num_read = 0;
    } while (i < str.length());  // case iv
    // First copy the un-escaped prefix, if any, to the output ByteSink.
    if (i > 0) input->CopyTo(output, i);
    if (num_read > 0) input->Skip(num_read);
    if (!ok) {
      // Case iii: Report error.
      // TODO(wpoon): Add error reporting.
      num_left = 0;
    } else if (num_left == 0 && !escaped.empty()) {
      // Case i or ii: Append the escaped code point to the output ByteSink.
      output->Append(escaped.data(), escaped.size());
    }
  }
  if (num_left > 0) {
    // Treat as case iii: report error.
    // TODO(wpoon): Add error reporting.
  }
}